

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProvingHelper.cpp
# Opt level: O2

void Saturation::ProvingHelper::runVampire(Problem *prb,Options *opt)

{
  uint s;
  ClauseIterator clauses;
  Preprocess prepro;
  VirtualIterator<Kernel::Clause_*> local_28;
  Preprocess local_20;
  
  s = (opt->_randomSeed).super_OptionValue<unsigned_int>.actualValue;
  if (s == 0) {
    Lib::Random::resetSeed();
  }
  else {
    Lib::Random::setSeed(s);
  }
  local_28._core = (IteratorCore<Kernel::Clause_*> *)0x0;
  local_20._clausify = true;
  local_20._stillSimplify = false;
  local_20._options = opt;
  Shell::Preprocess::preprocess(&local_20,prb);
  runVampireSaturationImpl(prb,opt);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_28);
  return;
}

Assistant:

void ProvingHelper::runVampire(Problem& prb, const Options& opt)
{
  // Here officially starts preprocessing of the porfolio mode (separately for each worker)
  // and that's the moment we want to set the random seed
  // (no randomness in parsing, for the peace of mind - parsing was done by the master process!)
  // the main reason being that we want to stay in sync with what vampire mode does
  // cf getPreprocessedProblem in vampire.cpp
  if (opt.randomSeed() != 0) {
    Lib::Random::setSeed(opt.randomSeed());
  } else {
    Lib::Random::resetSeed();
  }

  try
  {
    ClauseIterator clauses;
    {
      TIME_TRACE(TimeTrace::PREPROCESSING);

      Preprocess prepro(opt);
      prepro.preprocess(prb);
    }
    runVampireSaturationImpl(prb, opt);
  }
  catch(const std::bad_alloc &) {
    env.statistics->terminationReason=TerminationReason::MEMORY_LIMIT;
    env.statistics->refutation=0;
  }
  catch(TimeLimitExceededException&) {
    env.statistics->terminationReason=TerminationReason::TIME_LIMIT;
    env.statistics->refutation=0;
  }
  catch(ActivationLimitExceededException&) {
    env.statistics->terminationReason=TerminationReason::ACTIVATION_LIMIT;
    env.statistics->refutation=0;
  }
}